

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::MessageHasConflictingClassName
          (anon_unknown_0 *this,Descriptor *message,string_view classname,NameEquality equality_mode
          )

{
  int iVar1;
  bool bVar2;
  NameEquality NVar3;
  Descriptor *this_00;
  EnumDescriptor *pEVar4;
  int i;
  int iVar5;
  string_view b;
  string_view classname_00;
  string_view b_00;
  string_view a;
  string_view a_00;
  
  b._M_str = (char *)classname._M_len;
  b._M_len = (size_t)message;
  a._M_str = (char *)**(undefined8 **)(this + 8);
  a._M_len = (*(undefined8 **)(this + 8))[1];
  NVar3 = CheckNameEquality(a,b);
  if (NVar3 == (NameEquality)classname._M_str) {
    return true;
  }
  iVar5 = 0;
  do {
    if (*(int *)(this + 0x80) <= iVar5) {
      iVar5 = 0;
      do {
        iVar1 = *(int *)(this + 0x84);
        bVar2 = iVar5 < iVar1;
        if (iVar1 <= iVar5) {
          return bVar2;
        }
        pEVar4 = Descriptor::enum_type((Descriptor *)this,iVar5);
        b_00._M_str = (char *)classname._M_len;
        b_00._M_len = (size_t)message;
        a_00._M_str = (char *)**(undefined8 **)(pEVar4 + 8);
        a_00._M_len = (*(undefined8 **)(pEVar4 + 8))[1];
        NVar3 = CheckNameEquality(a_00,b_00);
        iVar5 = iVar5 + 1;
      } while (NVar3 != (NameEquality)classname._M_str);
      return bVar2;
    }
    this_00 = Descriptor::nested_type((Descriptor *)this,iVar5);
    classname_00._M_str._4_4_ = 0;
    classname_00._0_12_ = classname._0_12_;
    bVar2 = MessageHasConflictingClassName
                      ((anon_unknown_0 *)this_00,message,classname_00,equality_mode);
    iVar5 = iVar5 + 1;
  } while (!bVar2);
  return true;
}

Assistant:

bool MessageHasConflictingClassName(const Descriptor* message,
                                    absl::string_view classname,
                                    NameEquality equality_mode) {
  if (CheckNameEquality(message->name(), classname) == equality_mode) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); ++i) {
    if (MessageHasConflictingClassName(message->nested_type(i), classname,
                                       equality_mode)) {
      return true;
    }
  }
  for (int i = 0; i < message->enum_type_count(); ++i) {
    if (CheckNameEquality(message->enum_type(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  return false;
}